

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetA.c
# Opt level: O2

int point_mul_g_id_tc26_gost_3410_2012_512_paramSetA
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,BN_CTX *ctx)

{
  char cVar1;
  int iVar2;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  pt_aff_t_conflict2 (*papVar8) [16];
  pt_aff_t_conflict2 *ppVar9;
  uint uVar10;
  limb_t *plVar11;
  uint64_t *puVar12;
  bool bVar13;
  byte bVar14;
  uchar b_n [64];
  uchar b_x [64];
  uint64_t local_368 [10];
  uint64_t local_318 [10];
  uchar b_y [64];
  uint64_t local_278 [10];
  uint64_t local_228 [10];
  int8_t rnaf [103];
  uint64_t local_170 [10];
  uint64_t local_120 [10];
  pt_aff_t_conflict2 local_d0;
  
  bVar14 = 0;
  BN_CTX_start((BN_CTX *)ctx);
  pBVar3 = BN_CTX_get((BN_CTX *)ctx);
  pBVar4 = BN_CTX_get((BN_CTX *)ctx);
  iVar7 = 0;
  if ((pBVar4 != (BIGNUM *)0x0) && (iVar2 = BN_bn2lebinpad(n,b_n,0x40), iVar2 == 0x40)) {
    rnaf[0x50] = '\0';
    rnaf[0x51] = '\0';
    rnaf[0x52] = '\0';
    rnaf[0x53] = '\0';
    rnaf[0x54] = '\0';
    rnaf[0x55] = '\0';
    rnaf[0x56] = '\0';
    rnaf[0x57] = '\0';
    rnaf[0x58] = '\0';
    rnaf[0x59] = '\0';
    rnaf[0x5a] = '\0';
    rnaf[0x5b] = '\0';
    rnaf[0x5c] = '\0';
    rnaf[0x5d] = '\0';
    rnaf[0x5e] = '\0';
    rnaf[0x40] = '\0';
    rnaf[0x41] = '\0';
    rnaf[0x42] = '\0';
    rnaf[0x43] = '\0';
    rnaf[0x44] = '\0';
    rnaf[0x45] = '\0';
    rnaf[0x46] = '\0';
    rnaf[0x47] = '\0';
    rnaf[0x48] = '\0';
    rnaf[0x49] = '\0';
    rnaf[0x4a] = '\0';
    rnaf[0x4b] = '\0';
    rnaf[0x4c] = '\0';
    rnaf[0x4d] = '\0';
    rnaf[0x4e] = '\0';
    rnaf[0x4f] = '\0';
    rnaf[0x30] = '\0';
    rnaf[0x31] = '\0';
    rnaf[0x32] = '\0';
    rnaf[0x33] = '\0';
    rnaf[0x34] = '\0';
    rnaf[0x35] = '\0';
    rnaf[0x36] = '\0';
    rnaf[0x37] = '\0';
    rnaf[0x38] = '\0';
    rnaf[0x39] = '\0';
    rnaf[0x3a] = '\0';
    rnaf[0x3b] = '\0';
    rnaf[0x3c] = '\0';
    rnaf[0x3d] = '\0';
    rnaf[0x3e] = '\0';
    rnaf[0x3f] = '\0';
    rnaf[0x20] = '\0';
    rnaf[0x21] = '\0';
    rnaf[0x22] = '\0';
    rnaf[0x23] = '\0';
    rnaf[0x24] = '\0';
    rnaf[0x25] = '\0';
    rnaf[0x26] = '\0';
    rnaf[0x27] = '\0';
    rnaf[0x28] = '\0';
    rnaf[0x29] = '\0';
    rnaf[0x2a] = '\0';
    rnaf[0x2b] = '\0';
    rnaf[0x2c] = '\0';
    rnaf[0x2d] = '\0';
    rnaf[0x2e] = '\0';
    rnaf[0x2f] = '\0';
    rnaf[0x10] = '\0';
    rnaf[0x11] = '\0';
    rnaf[0x12] = '\0';
    rnaf[0x13] = '\0';
    rnaf[0x14] = '\0';
    rnaf[0x15] = '\0';
    rnaf[0x16] = '\0';
    rnaf[0x17] = '\0';
    rnaf[0x18] = '\0';
    rnaf[0x19] = '\0';
    rnaf[0x1a] = '\0';
    rnaf[0x1b] = '\0';
    rnaf[0x1c] = '\0';
    rnaf[0x1d] = '\0';
    rnaf[0x1e] = '\0';
    rnaf[0x1f] = '\0';
    rnaf[0] = '\0';
    rnaf[1] = '\0';
    rnaf[2] = '\0';
    rnaf[3] = '\0';
    rnaf[4] = '\0';
    rnaf[5] = '\0';
    rnaf[6] = '\0';
    rnaf[7] = '\0';
    rnaf[8] = '\0';
    rnaf[9] = '\0';
    rnaf[10] = '\0';
    rnaf[0xb] = '\0';
    rnaf[0xc] = '\0';
    rnaf[0xd] = '\0';
    rnaf[0xe] = '\0';
    rnaf[0xf] = '\0';
    rnaf[0x5f] = '\0';
    rnaf[0x60] = '\0';
    rnaf[0x61] = '\0';
    rnaf[0x62] = '\0';
    rnaf[99] = '\0';
    rnaf[100] = '\0';
    rnaf[0x65] = '\0';
    rnaf[0x66] = '\0';
    memset(b_y,0,0xf0);
    memset(&local_d0,0,0xa0);
    scalar_rwnaf(rnaf,b_n);
    b_x[0x30] = '\0';
    b_x[0x31] = '\0';
    b_x[0x32] = '\0';
    b_x[0x33] = '\0';
    b_x[0x34] = '\0';
    b_x[0x35] = '\0';
    b_x[0x36] = '\0';
    b_x[0x37] = '\0';
    b_x[0x38] = '\0';
    b_x[0x39] = '\0';
    b_x[0x3a] = '\0';
    b_x[0x3b] = '\0';
    b_x[0x3c] = '\0';
    b_x[0x3d] = '\0';
    b_x[0x3e] = '\0';
    b_x[0x3f] = '\0';
    b_x[0x20] = '\0';
    b_x[0x21] = '\0';
    b_x[0x22] = '\0';
    b_x[0x23] = '\0';
    b_x[0x24] = '\0';
    b_x[0x25] = '\0';
    b_x[0x26] = '\0';
    b_x[0x27] = '\0';
    b_x[0x28] = '\0';
    b_x[0x29] = '\0';
    b_x[0x2a] = '\0';
    b_x[0x2b] = '\0';
    b_x[0x2c] = '\0';
    b_x[0x2d] = '\0';
    b_x[0x2e] = '\0';
    b_x[0x2f] = '\0';
    b_x[0x10] = '\0';
    b_x[0x11] = '\0';
    b_x[0x12] = '\0';
    b_x[0x13] = '\0';
    b_x[0x14] = '\0';
    b_x[0x15] = '\0';
    b_x[0x16] = '\0';
    b_x[0x17] = '\0';
    b_x[0x18] = '\0';
    b_x[0x19] = '\0';
    b_x[0x1a] = '\0';
    b_x[0x1b] = '\0';
    b_x[0x1c] = '\0';
    b_x[0x1d] = '\0';
    b_x[0x1e] = '\0';
    b_x[0x1f] = '\0';
    b_x[0] = '\0';
    b_x[1] = '\0';
    b_x[2] = '\0';
    b_x[3] = '\0';
    b_x[4] = '\0';
    b_x[5] = '\0';
    b_x[6] = '\0';
    b_x[7] = '\0';
    b_x[8] = '\0';
    b_x[9] = '\0';
    b_x[10] = '\0';
    b_x[0xb] = '\0';
    b_x[0xc] = '\0';
    b_x[0xd] = '\0';
    b_x[0xe] = '\0';
    b_x[0xf] = '\0';
    plVar11 = const_one;
    puVar12 = local_368;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar12 = *plVar11;
      plVar11 = plVar11 + (ulong)bVar14 * -2 + 1;
      puVar12 = puVar12 + (ulong)bVar14 * -2 + 1;
    }
    local_318[8] = 0;
    local_318[9] = 0;
    local_318[6] = 0;
    local_318[7] = 0;
    local_318[4] = 0;
    local_318[5] = 0;
    local_318[2] = 0;
    local_318[3] = 0;
    local_318[0] = 0;
    local_318[1] = 0;
    puVar12 = local_d0.Y;
    for (uVar10 = 9; -1 < (int)uVar10; uVar10 = uVar10 - 1) {
      if (uVar10 != 9) {
        iVar7 = 5;
        while (bVar13 = iVar7 != 0, iVar7 = iVar7 + -1, bVar13) {
          point_double((pt_prj_t_conflict2 *)b_x,(pt_prj_t_conflict2 *)b_x);
        }
      }
      papVar8 = lut_cmb;
      for (lVar6 = 0; lVar6 != 0xc; lVar6 = lVar6 + 1) {
        lVar5 = lVar6 * 10 + (ulong)uVar10;
        if ((int)lVar5 < 0x67) {
          cVar1 = rnaf[lVar5];
          lVar5 = 0;
          ppVar9 = *papVar8;
          for (; lVar5 != 0x10; lVar5 = lVar5 + 1) {
            bVar13 = (int)((int)(char)(-1 - (cVar1 >> 7)) + ((int)cVar1 >> 0x1f ^ (int)cVar1) >> 1 ^
                          (uint)lVar5) < 1;
            fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz
                      (local_d0.X,bVar13,local_d0.X,ppVar9->X);
            fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(puVar12,bVar13,puVar12,ppVar9->Y);
            ppVar9 = ppVar9 + 1;
          }
          fiat_id_tc26_gost_3410_2012_512_paramSetA_opp(local_120,puVar12);
          fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz
                    (puVar12,(byte)(cVar1 >> 7) >> 7,puVar12,local_120);
          point_add_mixed((pt_prj_t_conflict2 *)b_x,(pt_prj_t_conflict2 *)b_x,&local_d0);
        }
        papVar8 = (pt_aff_t_conflict2 (*) [16])((long)papVar8 + 0xa00);
      }
    }
    papVar8 = lut_cmb;
    ppVar9 = &local_d0;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      ppVar9->X[0] = (*papVar8)[0].X[0];
      papVar8 = (pt_aff_t_conflict2 (*) [16])((long)papVar8 + ((ulong)bVar14 * -2 + 1) * 8);
      ppVar9 = (pt_aff_t_conflict2 *)((long)ppVar9 + (ulong)bVar14 * -0x10 + 8);
    }
    fiat_id_tc26_gost_3410_2012_512_paramSetA_opp(puVar12,lut_cmb[0][0].Y);
    point_add_mixed((pt_prj_t_conflict2 *)b_y,(pt_prj_t_conflict2 *)b_x,&local_d0);
    bVar14 = b_n[0] & 1;
    fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz
              ((uint64_t *)b_x,bVar14,(uint64_t *)b_y,(uint64_t *)b_x);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(local_368,bVar14,local_278,local_368);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(local_318,bVar14,local_228,local_318);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_inv(local_318,local_318);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_170,(uint64_t *)b_x,local_318);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_120,local_368,local_318);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_to_bytes(b_x,local_170);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_to_bytes(b_y,local_120);
    iVar7 = CRYPTO_memcmp("",b_x,0x40);
    if ((iVar7 == 0) && (iVar7 = CRYPTO_memcmp("",b_y,0x40), iVar7 == 0)) {
      iVar7 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar7 == 0) {
        iVar7 = 0;
        goto LAB_0012d4dc;
      }
    }
    else {
      lVar6 = BN_lebin2bn(b_x,0x40,pBVar3);
      iVar7 = 0;
      if ((lVar6 == 0) ||
         ((lVar6 = BN_lebin2bn(b_y,0x40,pBVar4), lVar6 == 0 ||
          (iVar2 = EC_POINT_set_affine_coordinates(group,r,pBVar3,pBVar4,ctx), iVar2 == 0))))
      goto LAB_0012d4dc;
    }
    iVar7 = 1;
  }
LAB_0012d4dc:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar7;
}

Assistant:

int
    point_mul_g_id_tc26_gost_3410_2012_512_paramSetA(const EC_GROUP *group,
                                                     EC_POINT *r,
                                                     const BIGNUM *n,
                                                     BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[64];
    unsigned char b_y[64];
    unsigned char b_n[64];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL || BN_bn2lebinpad(n, b_n, 64) != 64)
        goto err;
    /* do the fixed scalar multiplication */
    point_mul_g(b_x, b_y, b_n);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 64) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 64) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 64, x) == NULL ||
            BN_lebin2bn(b_y, 64, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}